

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O2

void __thiscall kj::parse::anon_unknown_0::TestCase394::run(TestCase394 *this)

{
  bool bVar1;
  char *start;
  char *pcVar2;
  AddFailureAdapter local_58;
  TransformWithLocation_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:399:7)>
  parser;
  Input input;
  
  parser._4_1_ = 0;
  parser.subParser.first.expected = 'f';
  parser.subParser.rest.first.expected = 'o';
  parser.subParser.rest.rest = (Sequence_<kj::parse::Exactly_<char>_>)0x6f;
  input.parent = (IteratorInput<char,_const_char_*> *)0x0;
  input.pos = "foo";
  input.end = "";
  input.best = "foo";
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>::
  parseNext<kj::parse::IteratorInput<char,_const_char_*>_>
            ((Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
              *)&local_58,(IteratorInput<char,_const_char_*> *)&parser);
  if (local_58.handled == true) {
    pcVar2 = input.pos + -0x357ec6;
    local_58._0_8_ = "foo";
    local_58.file = pcVar2;
    bVar1 = operator==("foo",(StringPtr *)&local_58);
    if (!bVar1 && kj::_::Debug::minSeverity < 3) {
      local_58._0_8_ = "foo";
      local_58.file = pcVar2;
      kj::_::Debug::log<char_const(&)[74],char_const(&)[4],kj::StringPtr>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,400,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (StringPtr(location.begin(), location.end()))\", \"foo\", StringPtr(location.begin(), location.end())"
                 ,(char (*) [74])
                  "failed: expected (\"foo\") == (StringPtr(location.begin(), location.end()))",
                 (char (*) [4])0x357ec7,(StringPtr *)&local_58);
    }
  }
  else {
    local_58._0_8_ = local_58._0_8_ & 0xffffffffffffff00;
    local_58.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
    ;
    local_58.line = 0x19a;
    AddFailureAdapter::operator<<(&local_58,(char (*) [24])"Expected 123, got null.");
    AddFailureAdapter::~AddFailureAdapter(&local_58);
  }
  if ((input.pos != input.end) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[31]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x19c,ERROR,"\"failed: expected \" \"input.atEnd()\"",
               (char (*) [31])"failed: expected input.atEnd()");
  }
  IteratorInput<char,_const_char_*>::~IteratorInput(&input);
  return;
}

Assistant:

TEST(CommonParsers, TransformParser) {
  StringPtr text = "foo";

  auto parser = transformWithLocation(
      sequence(exactly('f'), exactly('o'), exactly('o')),
      [](Span<const char*> location) -> int {
        EXPECT_EQ("foo", StringPtr(location.begin(), location.end()));
        return 123;
      });

  {
    Input input(text.begin(), text.end());
    Maybe<int> result = parser(input);
    KJ_IF_MAYBE(i, result) {
      EXPECT_EQ(123, *i);
    } else {
      ADD_FAILURE() << "Expected 123, got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }